

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

AInventory * P_DropItem(AActor *source,PClassActor *type,int dropamount,int chance)

{
  byte *pbVar1;
  PClass *pPVar2;
  uint uVar3;
  int iVar4;
  AInventory *inv_00;
  undefined4 extraout_var;
  AInventory *inv;
  bool bVar6;
  DVector3 local_38;
  PClass *pPVar5;
  
  if ((type != (PClassActor *)0x0) &&
     (uVar3 = FRandom::GenRand32(&pr_dropitem), (int)(uVar3 & 0xff) <= chance)) {
    local_38.Z = 0.0;
    if (((byte)i_compatflags & 0x80) == 0) {
      iVar4 = sv_dropstyle.Value;
      if (sv_dropstyle.Value == 0) {
        iVar4 = gameinfo.defaultdropstyle;
      }
      if (iVar4 == 2) {
        local_38.Z = 24.0;
      }
      else {
        local_38.Z = source->Height * 0.5;
      }
    }
    local_38.Z = local_38.Z + (source->__Pos).Z;
    local_38.X = (source->__Pos).X;
    local_38.Y = (source->__Pos).Y;
    inv_00 = (AInventory *)AActor::StaticSpawn(type,&local_38,ALLOW_REPLACE,false);
    if (inv_00 != (AInventory *)0x0) {
      (inv_00->super_AActor).flags.Value = (inv_00->super_AActor).flags.Value & 0xfffdfdff | 0x20000
      ;
      if (((byte)i_compatflags & 0x80) == 0) {
        P_TossItem((AActor *)inv_00);
      }
      pPVar2 = AInventory::RegistrationInfo.MyClass;
      pPVar5 = (inv_00->super_AActor).super_DThinker.super_DObject.Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**(inv_00->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv_00);
        pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
        (inv_00->super_AActor).super_DThinker.super_DObject.Class = pPVar5;
      }
      bVar6 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar2 && bVar6) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar6 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar2) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (bVar6) {
        ModifyDropAmount(inv_00,dropamount);
        pbVar1 = (byte *)((long)&inv_00->ItemFlags + 2);
        *pbVar1 = *pbVar1 | 0x40;
        bVar6 = AInventory::CallSpecialDropAction(inv_00,source);
        if (!bVar6) {
          return inv_00;
        }
        (*(inv_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(inv_00);
      }
    }
  }
  return (AInventory *)0x0;
}

Assistant:

AInventory *P_DropItem (AActor *source, PClassActor *type, int dropamount, int chance)
{
	if (type != NULL && pr_dropitem() <= chance)
	{
		AActor *mo;
		double spawnz = 0;

		if (!(i_compatflags & COMPATF_NOTOSSDROPS))
		{
			int style = sv_dropstyle;
			if (style == 0)
			{
				style = gameinfo.defaultdropstyle;
			}
			if (style == 2)
			{
				spawnz = 24;
			}
			else
			{
				spawnz = source->Height / 2;
			}
		}
		mo = Spawn(type, source->PosPlusZ(spawnz), ALLOW_REPLACE);
		if (mo != NULL)
		{
			mo->flags |= MF_DROPPED;
			mo->flags &= ~MF_NOGRAVITY;	// [RH] Make sure it is affected by gravity
			if (!(i_compatflags & COMPATF_NOTOSSDROPS))
			{
				P_TossItem (mo);
			}
			if (mo->IsKindOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *inv = static_cast<AInventory *>(mo);
				ModifyDropAmount(inv, dropamount);
				inv->ItemFlags |= IF_TOSSED;
				if (inv->CallSpecialDropAction (source))
				{
					// The special action indicates that the item should not spawn
					inv->Destroy();
					return NULL;
				}
				return inv;
			}
			// we can't really return an AInventory pointer to a non-inventory item here, can we?
		}
	}
	return NULL;
}